

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntCountUnique(Vec_Int_t *p)

{
  int iVar1;
  void *__ptr;
  uchar *pPres;
  int local_18;
  int Max;
  int Count;
  int i;
  Vec_Int_t *p_local;
  
  local_18 = 0;
  iVar1 = Vec_IntFindMax(p);
  __ptr = calloc((long)(iVar1 + 1),1);
  for (Max = 0; Max < p->nSize; Max = Max + 1) {
    if (*(char *)((long)__ptr + (long)p->pArray[Max]) == '\0') {
      *(undefined1 *)((long)__ptr + (long)p->pArray[Max]) = 1;
      local_18 = local_18 + 1;
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return local_18;
}

Assistant:

static inline int Vec_IntCountUnique( Vec_Int_t * p )
{
    int i, Count = 0, Max = Vec_IntFindMax(p);
    unsigned char * pPres = ABC_CALLOC( unsigned char, Max+1 );
    for ( i = 0; i < p->nSize; i++ )
        if ( pPres[p->pArray[i]] == 0 )
            pPres[p->pArray[i]] = 1, Count++;
    ABC_FREE( pPres );
    return Count;
}